

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void dmlc::json::
     MapHandler<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>_>
     ::Read(JSONReader *reader,
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
           *map)

{
  bool bVar1;
  mapped_type *this;
  undefined1 local_98 [8];
  ElemType value;
  undefined1 local_38 [8];
  string key;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
  *map_local;
  JSONReader *reader_local;
  
  key.field_2._8_8_ = map;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
  ::clear(map);
  JSONReader::BeginObject(reader);
  std::__cxx11::string::string((string *)local_38);
  while( true ) {
    bVar1 = JSONReader::NextObjectItem(reader,(string *)local_38);
    if (!bVar1) break;
    tvm::runtime::FunctionInfo::FunctionInfo((FunctionInfo *)local_98);
    JSONReader::Read<tvm::runtime::FunctionInfo>(reader,(FunctionInfo *)local_98);
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
                         *)key.field_2._8_8_,(key_type *)local_38);
    tvm::runtime::FunctionInfo::operator=(this,(FunctionInfo *)local_98);
    tvm::runtime::FunctionInfo::~FunctionInfo((FunctionInfo *)local_98);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

inline static void Read(JSONReader *reader, ContainerType *map) {
    typedef typename ContainerType::mapped_type ElemType;
    map->clear();
    reader->BeginObject();
    std::string key;
    while (reader->NextObjectItem(&key)) {
      ElemType value;
      reader->Read(&value);
      (*map)[key] = value;
    }
  }